

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pragmaFunclistLine(Vdbe *v,FuncDef *p,int isBuiltin,int showInternFuncs)

{
  uint uVar1;
  char *pcVar2;
  
  for (; p != (FuncDef *)0x0; p = p->pNext) {
    if ((p->xSFunc != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) &&
       ((uVar1 = p->funcFlags, showInternFuncs != 0 || ((uVar1 & 0x40000) == 0)))) {
      pcVar2 = "w";
      if ((p->xValue == (_func_void_sqlite3_context_ptr *)0x0) &&
         (pcVar2 = "a", p->xFinalize == (_func_void_sqlite3_context_ptr *)0x0)) {
        pcVar2 = "s";
      }
      sqlite3VdbeMultiLoad
                (v,1,"sissii",p->zName,(ulong)(uint)isBuiltin,pcVar2,
                 pragmaFunclistLine::azEnc[uVar1 & 3],(ulong)(uint)(int)p->nArg,
                 (ulong)(uVar1 & (-(uint)(showInternFuncs != 0) | 0x3c0800) ^ 0x200000));
    }
  }
  return;
}

Assistant:

static void pragmaFunclistLine(
  Vdbe *v,               /* The prepared statement being created */
  FuncDef *p,            /* A particular function definition */
  int isBuiltin,         /* True if this is a built-in function */
  int showInternFuncs    /* True if showing internal functions */
){
  u32 mask =
      SQLITE_DETERMINISTIC |
      SQLITE_DIRECTONLY |
      SQLITE_SUBTYPE |
      SQLITE_INNOCUOUS |
      SQLITE_FUNC_INTERNAL
  ;
  if( showInternFuncs ) mask = 0xffffffff;
  for(; p; p=p->pNext){
    const char *zType;
    static const char *azEnc[] = { 0, "utf8", "utf16le", "utf16be" };

    assert( SQLITE_FUNC_ENCMASK==0x3 );
    assert( strcmp(azEnc[SQLITE_UTF8],"utf8")==0 );
    assert( strcmp(azEnc[SQLITE_UTF16LE],"utf16le")==0 );
    assert( strcmp(azEnc[SQLITE_UTF16BE],"utf16be")==0 );

    if( p->xSFunc==0 ) continue;
    if( (p->funcFlags & SQLITE_FUNC_INTERNAL)!=0
     && showInternFuncs==0
    ){
      continue;
    }
    if( p->xValue!=0 ){
      zType = "w";
    }else if( p->xFinalize!=0 ){
      zType = "a";
    }else{
      zType = "s";
    }
    sqlite3VdbeMultiLoad(v, 1, "sissii",
       p->zName, isBuiltin,
       zType, azEnc[p->funcFlags&SQLITE_FUNC_ENCMASK],
       p->nArg,
       (p->funcFlags & mask) ^ SQLITE_INNOCUOUS
    );
  }
}